

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpBroker.cpp
# Opt level: O0

void __thiscall helics::tcp::TcpBrokerSS::TcpBrokerSS(TcpBrokerSS *this,string_view broker_name)

{
  string_view broker_name_00;
  size_t in_RDX;
  NetworkBroker<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0,_11> *in_RSI;
  undefined8 *in_RDI;
  char *unaff_retaddr;
  
  broker_name_00._M_str = unaff_retaddr;
  broker_name_00._M_len = in_RDX;
  NetworkBroker<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0,_11>::NetworkBroker
            (in_RSI,broker_name_00);
  *in_RDI = &PTR__TcpBrokerSS_00a4cd88;
  in_RDI[1] = &DAT_00a4cee8;
  *(undefined1 *)(in_RDI + 500) = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x4bb2b7);
  return;
}

Assistant:

TcpBrokerSS::TcpBrokerSS(std::string_view broker_name): NetworkBroker(broker_name) {}